

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_traverse_dashed
               (plutovg_path_t *path,float offset,float *dashes,int ndashes,
               plutovg_path_traverse_func_t traverse_func,void *closure)

{
  int iVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float *local_60;
  int local_58;
  float local_54;
  float local_50;
  int local_4c;
  int local_48;
  byte local_44;
  byte local_43;
  undefined8 local_40;
  plutovg_path_traverse_func_t local_38;
  void *local_30;
  
  if (ndashes < 1) {
    fVar4 = 0.0;
  }
  else {
    fVar4 = 0.0;
    uVar2 = 0;
    do {
      fVar4 = fVar4 + dashes[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)ndashes != uVar2);
  }
  if ((ndashes & 0x80000001U) == 1) {
    fVar4 = fVar4 + fVar4;
  }
  if (fVar4 <= 0.0) {
    plutovg_path_traverse(path,traverse_func,closure);
    return;
  }
  local_60 = dashes;
  local_58 = ndashes;
  fVar3 = fmodf(offset,fVar4);
  local_54 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar3 |
                    (uint)(fVar4 + fVar3) & -(uint)(fVar3 < 0.0));
  if (local_54 <= 0.0) {
    local_4c = 0;
    local_44 = 1;
  }
  else {
    fVar4 = *dashes;
    if (fVar4 <= local_54) {
      local_44 = 1;
      iVar1 = 1;
      do {
        local_4c = iVar1;
        local_54 = local_54 - fVar4;
        local_44 = local_44 ^ 1;
        if (local_54 <= 0.0) break;
        fVar4 = dashes[(long)local_4c % (long)ndashes & 0xffffffff];
        iVar1 = local_4c + 1;
      } while (fVar4 <= local_54);
    }
    else {
      local_4c = 0;
      local_44 = 1;
    }
  }
  local_40 = 0;
  local_50 = local_54;
  local_48 = local_4c;
  local_43 = local_44;
  local_38 = traverse_func;
  local_30 = closure;
  plutovg_path_traverse_flatten(path,dash_traverse_func,&local_60);
  return;
}

Assistant:

void plutovg_path_traverse_dashed(const plutovg_path_t* path, float offset, const float* dashes, int ndashes, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    float dash_sum = 0.f;
    for(int i = 0; i < ndashes; ++i)
        dash_sum += dashes[i];
    if(ndashes % 2 == 1)
        dash_sum *= 2.f;
    if(dash_sum <= 0.f) {
        plutovg_path_traverse(path, traverse_func, closure);
        return;
    }

    dasher_t dasher;
    dasher.dashes = dashes;
    dasher.ndashes = ndashes;
    dasher.start_phase = fmodf(offset, dash_sum);
    if(dasher.start_phase < 0.f)
        dasher.start_phase += dash_sum;
    dasher.start_index = 0;
    dasher.start_toggle = true;
    while(dasher.start_phase > 0.f && dasher.start_phase >= dasher.dashes[dasher.start_index % dasher.ndashes]) {
        dasher.start_phase -= dashes[dasher.start_index % dasher.ndashes];
        dasher.start_toggle = !dasher.start_toggle;
        dasher.start_index++;
    }

    dasher.phase = dasher.start_phase;
    dasher.index = dasher.start_index;
    dasher.toggle = dasher.start_toggle;
    dasher.current_point = PLUTOVG_EMPTY_POINT;
    dasher.traverse_func = traverse_func;
    dasher.closure = closure;
    plutovg_path_traverse_flatten(path, dash_traverse_func, &dasher);
}